

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameconfigfile.cpp
# Opt level: O2

void __thiscall FGameConfigFile::ArchiveGlobalData(FGameConfigFile *this)

{
  FConfigFile::SetSection(&this->super_FConfigFile,"LastRun",true);
  FConfigFile::ClearCurrentSection(&this->super_FConfigFile);
  FConfigFile::SetValueForKey(&this->super_FConfigFile,"Version","211",false);
  FConfigFile::SetSection(&this->super_FConfigFile,"GlobalSettings",true);
  FConfigFile::ClearCurrentSection(&this->super_FConfigFile);
  C_ArchiveCVars(&this->super_FConfigFile,0x401);
  FConfigFile::SetSection(&this->super_FConfigFile,"GlobalSettings.Unknown",true);
  FConfigFile::ClearCurrentSection(&this->super_FConfigFile);
  C_ArchiveCVars(&this->super_FConfigFile,0x501);
  return;
}

Assistant:

void FGameConfigFile::ArchiveGlobalData ()
{
	SetSection ("LastRun", true);
	ClearCurrentSection ();
	SetValueForKey ("Version", LASTRUNVERSION);

	SetSection ("GlobalSettings", true);
	ClearCurrentSection ();
	C_ArchiveCVars (this, CVAR_ARCHIVE|CVAR_GLOBALCONFIG);

	SetSection ("GlobalSettings.Unknown", true);
	ClearCurrentSection ();
	C_ArchiveCVars (this, CVAR_ARCHIVE|CVAR_GLOBALCONFIG|CVAR_AUTO);
}